

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O3

bool ImGui::InputTextWithHint
               (char *label,char *hint,string *str,ImGuiInputTextFlags flags,
               ImGuiInputTextCallback callback,void *user_data)

{
  char *buf;
  bool bVar1;
  size_t buf_size;
  InputTextCallback_UserData cb_user_data;
  string *local_48;
  ImGuiInputTextCallback local_40;
  void *local_38;
  
  if (((uint)flags >> 0x12 & 1) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/misc/cpp/imgui_stdlib.cpp"
                ,0x44,"InputTextWithHint","ImGui ASSERT FAILED: %s",
                "(flags & ImGuiInputTextFlags_CallbackResize) == 0");
  }
  buf = (str->_M_dataplus)._M_p;
  buf_size = 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buf != &str->field_2) {
    buf_size = (str->field_2)._M_allocated_capacity + 1;
  }
  local_48 = str;
  local_40 = callback;
  local_38 = user_data;
  bVar1 = InputTextWithHint(label,hint,buf,buf_size,flags | 0x40000,InputTextCallback,&local_48);
  return bVar1;
}

Assistant:

bool ImGui::InputTextWithHint(const char* label, const char* hint, std::string* str, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    IM_ASSERT((flags & ImGuiInputTextFlags_CallbackResize) == 0);
    flags |= ImGuiInputTextFlags_CallbackResize;

    InputTextCallback_UserData cb_user_data;
    cb_user_data.Str = str;
    cb_user_data.ChainCallback = callback;
    cb_user_data.ChainCallbackUserData = user_data;
    return InputTextWithHint(label, hint, (char*)str->c_str(), str->capacity() + 1, flags, InputTextCallback, &cb_user_data);
}